

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressContinueStream
                 (ZSTD_DStream *zds,char **op,char *oend,void *src,size_t srcSize)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t local_80;
  size_t local_78;
  size_t err_code_1;
  size_t decodedSize_1;
  size_t dstSize_1;
  size_t err_code;
  size_t decodedSize;
  size_t dstSize;
  int isSkipFrame;
  size_t srcSize_local;
  void *src_local;
  char *oend_local;
  char **op_local;
  ZSTD_DStream *zds_local;
  
  iVar1 = ZSTD_isSkipFrame(zds);
  if (zds->outBufferMode == ZSTD_bm_buffered) {
    if (iVar1 == 0) {
      local_78 = zds->outBuffSize - zds->outStart;
    }
    else {
      local_78 = 0;
    }
    sVar3 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,local_78,src,srcSize);
    uVar2 = ERR_isError(sVar3);
    if (uVar2 != 0) {
      return sVar3;
    }
    if ((sVar3 == 0) && (iVar1 == 0)) {
      zds->streamStage = zdss_read;
    }
    else {
      zds->outEnd = sVar3 + zds->outStart;
      zds->streamStage = zdss_flush;
    }
  }
  else {
    if (iVar1 == 0) {
      local_80 = (long)oend - (long)*op;
    }
    else {
      local_80 = 0;
    }
    sVar3 = ZSTD_decompressContinue(zds,*op,local_80,src,srcSize);
    uVar2 = ERR_isError(sVar3);
    if (uVar2 != 0) {
      return sVar3;
    }
    *op = *op + sVar3;
    zds->streamStage = zdss_read;
  }
  return 0;
}

Assistant:

static size_t ZSTD_decompressContinueStream(
            ZSTD_DStream* zds, char** op, char* oend,
            void const* src, size_t srcSize) {
    int const isSkipFrame = ZSTD_isSkipFrame(zds);
    if (zds->outBufferMode == ZSTD_bm_buffered) {
        size_t const dstSize = isSkipFrame ? 0 : zds->outBuffSize - zds->outStart;
        size_t const decodedSize = ZSTD_decompressContinue(zds,
                zds->outBuff + zds->outStart, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        if (!decodedSize && !isSkipFrame) {
            zds->streamStage = zdss_read;
        } else {
            zds->outEnd = zds->outStart + decodedSize;
            zds->streamStage = zdss_flush;
        }
    } else {
        /* Write directly into the output buffer */
        size_t const dstSize = isSkipFrame ? 0 : (size_t)(oend - *op);
        size_t const decodedSize = ZSTD_decompressContinue(zds, *op, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        *op += decodedSize;
        /* Flushing is not needed. */
        zds->streamStage = zdss_read;
        assert(*op <= oend);
        assert(zds->outBufferMode == ZSTD_bm_stable);
    }
    return 0;
}